

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall
QMakeEvaluator::evaluateConditional(QMakeEvaluator *this,QStringView cond,QString *where,int line)

{
  QStack<QMakeEvaluator::Location> *this_00;
  qsizetype *pqVar1;
  ushort uVar2;
  ProFile *pPVar3;
  VisitReturn VVar4;
  ProFile *this_01;
  iterator iVar5;
  char16_t *tokPtr;
  
  VVar4 = ReturnFalse;
  this_01 = QMakeParser::parsedProBlock(this->m_parser,cond,0,where,line,TestGrammar);
  if (this_01->m_ok == true) {
    this_00 = &this->m_locationStack;
    QtPrivate::QPodArrayOps<QMakeEvaluator::Location>::emplace<QMakeEvaluator::Location_const&>
              ((QPodArrayOps<QMakeEvaluator::Location> *)this_00,
               (this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size,&this->m_current
              );
    QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
    tokPtr = (this_01->m_proitems).d.ptr;
    if (tokPtr == (char16_t *)0x0) {
      tokPtr = (char16_t *)&QString::_empty;
    }
    (this->m_current).pro = this_01;
    (this->m_current).line = 0;
    VVar4 = visitProBlock(this,(ushort *)tokPtr);
    iVar5 = QList<QMakeEvaluator::Location>::end(&this_00->super_QList<QMakeEvaluator::Location>);
    pPVar3 = iVar5.i[-1].pro;
    uVar2 = iVar5.i[-1].line;
    pqVar1 = &(this->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size;
    *pqVar1 = *pqVar1 + -1;
    (this->m_current).pro = pPVar3;
    (this->m_current).line = uVar2;
  }
  ProFile::deref(this_01);
  return VVar4;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateConditional(
        QStringView cond, const QString &where, int line)
{
    VisitReturn ret = ReturnFalse;
    ProFile *pro = m_parser->parsedProBlock(cond, 0, where, line, QMakeParser::TestGrammar);
    if (pro->isOk()) {
        m_locationStack.push(m_current);
        ret = visitProBlock(pro, pro->tokPtr());
        m_current = m_locationStack.pop();
    }
    pro->deref();
    return ret;
}